

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

void __thiscall
cmMakefileProfilingData::RAII::RAII
          (RAII *this,cmMakefileProfilingData *data,string *category,string *name,
          optional<Json::Value> *args)

{
  _Optional_payload_base<Json::Value> local_50;
  
  this->Data = data;
  std::_Optional_base<Json::Value,_false,_false>::_Optional_base
            ((_Optional_base<Json::Value,_false,_false> *)&local_50,
             &args->super__Optional_base<Json::Value,_false,_false>);
  StartEntry(data,category,name,(optional<Json::Value> *)&local_50);
  std::_Optional_payload_base<Json::Value>::_M_reset(&local_50);
  return;
}

Assistant:

cmMakefileProfilingData::RAII::RAII(cmMakefileProfilingData& data,
                                    const std::string& category,
                                    const std::string& name,
                                    cm::optional<Json::Value> args)
  : Data(&data)
{
  this->Data->StartEntry(category, name, std::move(args));
}